

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O0

dht_state * __thiscall
libtorrent::dht::dht_tracker::state(dht_state *__return_storage_ptr__,dht_tracker *this)

{
  bool bVar1;
  node_id *__args_1;
  iterator __first;
  iterator __last;
  __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  local_b8;
  const_iterator local_b0;
  undefined1 local_a8 [8];
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  nodes;
  endpoint local_7c;
  address local_60;
  reference local_40;
  pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node> *n;
  const_iterator __end2;
  const_iterator __begin2;
  tracker_nodes_t *__range2;
  dht_tracker *this_local;
  dht_state *ret;
  
  dht_state::dht_state(__return_storage_ptr__);
  __end2 = ::std::
           map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
           ::begin(&this->m_nodes);
  n = (pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>
       *)::std::
         map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
         ::end(&this->m_nodes);
  while (bVar1 = ::std::operator!=(&__end2,(_Self *)&n), bVar1) {
    local_40 = ::std::
               _Rb_tree_const_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
               ::operator*(&__end2);
    libtorrent::aux::listen_socket_handle::get_local_endpoint(&local_7c,&local_40->first);
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address(&local_60,&local_7c);
    __args_1 = dht::node::nid(&(local_40->second).dht);
    ::std::
    vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>
    ::emplace_back<boost::asio::ip::address,libtorrent::digest32<160l>const&>
              ((vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>
                *)__return_storage_ptr__,&local_60,__args_1);
    anon_unknown_20::save_nodes
              ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                *)local_a8,&(local_40->second).dht);
    local_b8._M_current =
         (basic_endpoint<boost::asio::ip::udp> *)
         ::std::
         vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
         ::end(&__return_storage_ptr__->nodes);
    __gnu_cxx::
    __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const*,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
    ::__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>*>
              ((__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const*,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
                *)&local_b0,&local_b8);
    __first = ::std::
              vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
              ::begin((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                       *)local_a8);
    __last = ::std::
             vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
             ::end((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                    *)local_a8);
    ::std::
    vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>
    ::
    insert<__gnu_cxx::__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>*,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>,void>
              ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>
                *)&__return_storage_ptr__->nodes,local_b0,
               (__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                )__first._M_current,
               (__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                )__last._M_current);
    ::std::
    vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ::~vector((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
               *)local_a8);
    ::std::
    _Rb_tree_const_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

dht_state dht_tracker::state() const
	{
		dht_state ret;
		for (auto const& n : m_nodes)
		{
			// use the local rather than external address because if the user is behind NAT
			// we won't know the external IP on startup
			ret.nids.emplace_back(n.first.get_local_endpoint().address(), n.second.dht.nid());
			auto nodes = save_nodes(n.second.dht);
			ret.nodes.insert(ret.nodes.end(), nodes.begin(), nodes.end());
		}
		return ret;
	}